

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

int Ivy_NodeHasZeroSim(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)p->nSimWords;
  if (p->nSimWords < 1) {
    uVar2 = uVar3;
  }
  do {
    if (uVar2 == uVar3) {
      return 1;
    }
    lVar1 = uVar3 * 4;
    uVar3 = uVar3 + 1;
  } while (*(int *)((long)&pObj->pFanout->pFanout + lVar1) == 0);
  return 0;
}

Assistant:

int Ivy_NodeHasZeroSim( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj )
{
    Ivy_FraigSim_t * pSims;
    int i;
    pSims = Ivy_ObjSim(pObj);
    for ( i = 0; i < p->nSimWords; i++ )
        if ( pSims->pData[i] )
            return 0;
    return 1;
}